

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::GRULayerParams::CheckTypeAndMergeFrom(GRULayerParams *this,MessageLite *from)

{
  ulong uVar1;
  uint64_t uVar2;
  LogMessage *other;
  WeightParams *pWVar3;
  undefined1 *puVar4;
  Arena *pAVar5;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__GRULayerParams_00489968) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::GRULayerParams *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((GRULayerParams *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x89b7);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activations_).super_RepeatedPtrFieldBase,(RepeatedPtrFieldBase *)(from + 1));
  puVar4 = (undefined1 *)from[2]._internal_metadata_.ptr_;
  if ((WeightParams *)puVar4 != (WeightParams *)0x0 &&
      from != (MessageLite *)_GRULayerParams_default_instance_) {
    pWVar3 = this->updategateweightmatrix_;
    if (pWVar3 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pWVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar5);
      this->updategateweightmatrix_ = pWVar3;
      puVar4 = (undefined1 *)from[2]._internal_metadata_.ptr_;
    }
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,(WeightParams *)puVar4);
  }
  puVar4 = (undefined1 *)from[3]._vptr_MessageLite;
  if ((WeightParams *)puVar4 != (WeightParams *)0x0 &&
      from != (MessageLite *)_GRULayerParams_default_instance_) {
    pWVar3 = this->resetgateweightmatrix_;
    if (pWVar3 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pWVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar5);
      this->resetgateweightmatrix_ = pWVar3;
      puVar4 = (undefined1 *)from[3]._vptr_MessageLite;
    }
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,(WeightParams *)puVar4);
  }
  puVar4 = (undefined1 *)from[3]._internal_metadata_.ptr_;
  if ((WeightParams *)puVar4 != (WeightParams *)0x0 &&
      from != (MessageLite *)_GRULayerParams_default_instance_) {
    pWVar3 = this->outputgateweightmatrix_;
    if (pWVar3 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pWVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar5);
      this->outputgateweightmatrix_ = pWVar3;
      puVar4 = (undefined1 *)from[3]._internal_metadata_.ptr_;
    }
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,(WeightParams *)puVar4);
  }
  puVar4 = (undefined1 *)from[4]._vptr_MessageLite;
  if ((WeightParams *)puVar4 != (WeightParams *)0x0 &&
      from != (MessageLite *)_GRULayerParams_default_instance_) {
    pWVar3 = this->updategaterecursionmatrix_;
    if (pWVar3 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pWVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar5);
      this->updategaterecursionmatrix_ = pWVar3;
      puVar4 = (undefined1 *)from[4]._vptr_MessageLite;
    }
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,(WeightParams *)puVar4);
  }
  puVar4 = (undefined1 *)from[4]._internal_metadata_.ptr_;
  if ((WeightParams *)puVar4 != (WeightParams *)0x0 &&
      from != (MessageLite *)_GRULayerParams_default_instance_) {
    pWVar3 = this->resetgaterecursionmatrix_;
    if (pWVar3 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pWVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar5);
      this->resetgaterecursionmatrix_ = pWVar3;
      puVar4 = (undefined1 *)from[4]._internal_metadata_.ptr_;
    }
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,(WeightParams *)puVar4);
  }
  puVar4 = (undefined1 *)from[5]._vptr_MessageLite;
  if ((WeightParams *)puVar4 != (WeightParams *)0x0 &&
      from != (MessageLite *)_GRULayerParams_default_instance_) {
    pWVar3 = this->outputgaterecursionmatrix_;
    if (pWVar3 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pWVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar5);
      this->outputgaterecursionmatrix_ = pWVar3;
      puVar4 = (undefined1 *)from[5]._vptr_MessageLite;
    }
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,(WeightParams *)puVar4);
  }
  puVar4 = (undefined1 *)from[5]._internal_metadata_.ptr_;
  if ((WeightParams *)puVar4 != (WeightParams *)0x0 &&
      from != (MessageLite *)_GRULayerParams_default_instance_) {
    pWVar3 = this->updategatebiasvector_;
    if (pWVar3 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pWVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar5);
      this->updategatebiasvector_ = pWVar3;
      puVar4 = (undefined1 *)from[5]._internal_metadata_.ptr_;
    }
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,(WeightParams *)puVar4);
  }
  puVar4 = (undefined1 *)from[6]._vptr_MessageLite;
  if ((WeightParams *)puVar4 != (WeightParams *)0x0 &&
      from != (MessageLite *)_GRULayerParams_default_instance_) {
    pWVar3 = this->resetgatebiasvector_;
    if (pWVar3 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pWVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar5);
      this->resetgatebiasvector_ = pWVar3;
      puVar4 = (undefined1 *)from[6]._vptr_MessageLite;
    }
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,(WeightParams *)puVar4);
  }
  puVar4 = (undefined1 *)from[6]._internal_metadata_.ptr_;
  if ((WeightParams *)puVar4 != (WeightParams *)0x0 &&
      from != (MessageLite *)_GRULayerParams_default_instance_) {
    pWVar3 = this->outputgatebiasvector_;
    if (pWVar3 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pWVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar5);
      this->outputgatebiasvector_ = pWVar3;
      puVar4 = (undefined1 *)from[6]._internal_metadata_.ptr_;
    }
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar3,(WeightParams *)puVar4);
  }
  if (from[7]._vptr_MessageLite != (_func_int **)0x0) {
    this->inputvectorsize_ = (uint64_t)from[7]._vptr_MessageLite;
  }
  uVar2 = from[7]._internal_metadata_.ptr_;
  if (uVar2 != 0) {
    this->outputvectorsize_ = uVar2;
  }
  if (*(char *)&from[8]._vptr_MessageLite == '\x01') {
    this->sequenceoutput_ = true;
  }
  if (*(char *)((long)&from[8]._vptr_MessageLite + 1) == '\x01') {
    this->hasbiasvectors_ = true;
  }
  if (*(char *)((long)&from[8]._vptr_MessageLite + 2) == '\x01') {
    this->reverseinput_ = true;
  }
  uVar1 = (from->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}